

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

int xmlSchemaCheckFacetValues(xmlSchemaTypePtr typeDecl,xmlSchemaParserCtxtPtr pctxt)

{
  int iVar1;
  xmlChar *name_00;
  int iVar2;
  xmlSchemaFacetPtr local_38;
  xmlSchemaFacetPtr facet;
  xmlChar *name;
  int olderrs;
  int res;
  xmlSchemaParserCtxtPtr pctxt_local;
  xmlSchemaTypePtr typeDecl_local;
  
  iVar1 = pctxt->nberrors;
  name_00 = typeDecl->name;
  if (typeDecl->facets != (xmlSchemaFacetPtr)0x0) {
    local_38 = typeDecl->facets;
    if ((pctxt->vctxt == (xmlSchemaValidCtxtPtr)0x0) &&
       (iVar2 = xmlSchemaCreateVCtxtOnPCtxt(pctxt), iVar2 == -1)) {
      return -1;
    }
    pctxt->vctxt->schema = pctxt->schema;
    for (; local_38 != (xmlSchemaFacetPtr)0x0; local_38 = local_38->next) {
      iVar2 = xmlSchemaCheckFacet(local_38,typeDecl,pctxt,name_00);
      if (iVar2 == -1) {
        return -1;
      }
    }
    pctxt->vctxt->schema = (xmlSchemaPtr)0x0;
  }
  if (iVar1 == pctxt->nberrors) {
    typeDecl_local._4_4_ = 0;
  }
  else {
    typeDecl_local._4_4_ = pctxt->err;
  }
  return typeDecl_local._4_4_;
}

Assistant:

static int
xmlSchemaCheckFacetValues(xmlSchemaTypePtr typeDecl,
			  xmlSchemaParserCtxtPtr pctxt)
{
    int res, olderrs = pctxt->nberrors;
    const xmlChar *name = typeDecl->name;
    /*
    * NOTE: It is intended to use the facets list, instead
    * of facetSet.
    */
    if (typeDecl->facets != NULL) {
	xmlSchemaFacetPtr facet = typeDecl->facets;

	/*
	* Temporarily assign the "schema" to the validation context
	* of the parser context. This is needed for NOTATION validation.
	*/
	if (pctxt->vctxt == NULL) {
	    if (xmlSchemaCreateVCtxtOnPCtxt(pctxt) == -1)
		return(-1);
	}
	pctxt->vctxt->schema = pctxt->schema;
	while (facet != NULL) {
	    res = xmlSchemaCheckFacet(facet, typeDecl, pctxt, name);
	    HFAILURE
	    facet = facet->next;
	}
	pctxt->vctxt->schema = NULL;
    }
    if (olderrs != pctxt->nberrors)
	return(pctxt->err);
    return(0);
exit_failure:
    return(-1);
}